

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summary_test.cc
# Opt level: O0

void __thiscall
prometheus::anon_unknown_0::SummaryTest_sample_sum_Test::TestBody(SummaryTest_sample_sum_Test *this)

{
  initializer_list<prometheus::detail::CKMSQuantiles::Quantile> __l;
  bool bVar1;
  char *message;
  AssertHelper local_1f0;
  Message local_1e8;
  int local_1dc;
  undefined1 local_1d8 [8];
  AssertionResult gtest_ar;
  Summary s;
  ClientMetric metric;
  duration<long,_std::ratio<1L,_1L>_> local_108;
  milliseconds local_100;
  allocator<prometheus::detail::CKMSQuantiles::Quantile> local_e1;
  Quantile local_e0;
  Quantile *local_c0;
  size_type local_b8;
  vector<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
  local_b0;
  undefined1 local_98 [8];
  Summary summary;
  SummaryTest_sample_sum_Test *this_local;
  
  summary.quantile_values_.rotation_interval_.__r = (rep)this;
  detail::CKMSQuantiles::Quantile::Quantile(&local_e0,0.5,0.05);
  local_b8 = 1;
  local_c0 = &local_e0;
  std::allocator<prometheus::detail::CKMSQuantiles::Quantile>::allocator(&local_e1);
  __l._M_len = local_b8;
  __l._M_array = local_c0;
  std::
  vector<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
  ::vector(&local_b0,__l,&local_e1);
  metric.timestamp_ms._4_4_ = 0x3c;
  std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1l>> *)&local_108,(int *)((long)&metric.timestamp_ms + 4))
  ;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<long,std::ratio<1l,1l>,void>
            ((duration<long,std::ratio<1l,1000l>> *)&local_100,&local_108);
  Summary::Summary((Summary *)local_98,&local_b0,local_100,5);
  std::
  vector<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
  ::~vector(&local_b0);
  std::allocator<prometheus::detail::CKMSQuantiles::Quantile>::~allocator(&local_e1);
  Summary::Observe((Summary *)local_98,0.0);
  Summary::Observe((Summary *)local_98,1.0);
  Summary::Observe((Summary *)local_98,101.0);
  Summary::Collect((ClientMetric *)
                   &s.quantile.
                    super__Vector_base<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(Summary *)local_98);
  ClientMetric::Summary::Summary((Summary *)&gtest_ar.message_,(Summary *)&metric.info);
  local_1dc = 0x66;
  testing::internal::EqHelper::Compare<double,_int,_nullptr>
            ((EqHelper *)local_1d8,"s.sample_sum","102",(double *)&s,&local_1dc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d8);
  if (!bVar1) {
    testing::Message::Message(&local_1e8);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_1d8);
    testing::internal::AssertHelper::AssertHelper
              (&local_1f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/core/tests/summary_test.cc"
               ,0x26,message);
    testing::internal::AssertHelper::operator=(&local_1f0,&local_1e8);
    testing::internal::AssertHelper::~AssertHelper(&local_1f0);
    testing::Message::~Message(&local_1e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d8);
  ClientMetric::Summary::~Summary((Summary *)&gtest_ar.message_);
  ClientMetric::~ClientMetric
            ((ClientMetric *)
             &s.quantile.
              super__Vector_base<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  Summary::~Summary((Summary *)local_98);
  return;
}

Assistant:

TEST(SummaryTest, sample_sum) {
  Summary summary{Summary::Quantiles{{0.5, 0.05}}};
  summary.Observe(0);
  summary.Observe(1);
  summary.Observe(101);
  auto metric = summary.Collect();
  auto s = metric.summary;
  EXPECT_EQ(s.sample_sum, 102);
}